

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread.c
# Opt level: O0

void p_uthread_shutdown(void)

{
  PUThread *thread;
  PUThread *cur_thread;
  
  if (pp_uthread_specific_data != (PUThreadKey *)0x0) {
    thread = (PUThread *)p_uthread_get_local(pp_uthread_specific_data);
    if (thread != (PUThread *)0x0) {
      p_uthread_unref(thread);
      p_uthread_set_local(pp_uthread_specific_data,(ppointer)0x0);
    }
    p_uthread_local_free(pp_uthread_specific_data);
    pp_uthread_specific_data = (PUThreadKey *)0x0;
  }
  if (pp_uthread_new_spin != (PSpinLock *)0x0) {
    p_spinlock_free(pp_uthread_new_spin);
    pp_uthread_new_spin = (PSpinLock *)0x0;
  }
  p_uthread_shutdown_internal();
  return;
}

Assistant:

void
p_uthread_shutdown (void)
{
	PUThread *cur_thread;

	if (P_LIKELY (pp_uthread_specific_data != NULL)) {
		cur_thread = p_uthread_get_local (pp_uthread_specific_data);

		if (P_UNLIKELY (cur_thread != NULL)) {
			p_uthread_unref (cur_thread);
			p_uthread_set_local (pp_uthread_specific_data, NULL);
		}

		p_uthread_local_free (pp_uthread_specific_data);
		pp_uthread_specific_data = NULL;
	}

	if (P_LIKELY (pp_uthread_new_spin != NULL)) {
		p_spinlock_free (pp_uthread_new_spin);
		pp_uthread_new_spin = NULL;
	}

	p_uthread_shutdown_internal ();
}